

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O0

void WaterStep(Gamefield *gamefield,IntVec2 coords)

{
  _Bool _Var1;
  undefined8 in_RSI;
  Gamefield *in_RDI;
  IntVec2 new;
  Gamefield *in_stack_00000018;
  Gamefield *in_stack_00000020;
  int local_8;
  int iStack_4;
  
  local_8 = (int)in_RSI;
  iStack_4 = (int)((ulong)in_RSI >> 0x20);
  _Var1 = WithinBounds(in_RDI,local_8,iStack_4 + 1);
  if ((!_Var1) ||
     (_Var1 = CheckDensity(in_stack_00000018,(IntVec2 *)coords,(IntVec2 *)gamefield), !_Var1)) {
    _Var1 = WithinBounds(in_RDI,local_8,iStack_4 + -1);
    if ((_Var1) && (in_RDI->pixels[(iStack_4 + -1) * in_RDI->width + local_8].pixelType == Empty)) {
      SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
    }
    else {
      _Var1 = WithinBounds(in_RDI,local_8 + -1,iStack_4 + -1);
      if ((((_Var1) &&
           (in_RDI->pixels[(iStack_4 + -1) * in_RDI->width + local_8 + -1].pixelType == Empty)) &&
          (_Var1 = WithinBounds(in_RDI,local_8 + 1,iStack_4 + -1), _Var1)) &&
         (in_RDI->pixels[(iStack_4 + -1) * in_RDI->width + local_8 + 1].pixelType == Empty)) {
        SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
      }
      else {
        _Var1 = WithinBounds(in_RDI,local_8 + -1,iStack_4 + -1);
        if ((_Var1) &&
           (in_RDI->pixels[(iStack_4 + -1) * in_RDI->width + local_8 + -1].pixelType == Empty)) {
          SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
        }
        else {
          _Var1 = WithinBounds(in_RDI,local_8 + 1,iStack_4 + -1);
          if ((_Var1) &&
             (in_RDI->pixels[(iStack_4 + -1) * in_RDI->width + local_8 + 1].pixelType == Empty)) {
            SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
          }
          else {
            _Var1 = WithinBounds(in_RDI,local_8 + -1,iStack_4);
            if (((_Var1) &&
                (in_RDI->pixels[iStack_4 * in_RDI->width + local_8 + -1].pixelType == Empty)) &&
               ((_Var1 = WithinBounds(in_RDI,local_8 + 1,iStack_4), _Var1 &&
                (in_RDI->pixels[iStack_4 * in_RDI->width + local_8 + 1].pixelType == Empty)))) {
              SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
            }
            else {
              _Var1 = WithinBounds(in_RDI,local_8 + -1,iStack_4);
              if ((_Var1) &&
                 (in_RDI->pixels[iStack_4 * in_RDI->width + local_8 + -1].pixelType == Empty)) {
                SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
              }
              else {
                _Var1 = WithinBounds(in_RDI,local_8 + 1,iStack_4);
                if ((_Var1) &&
                   (in_RDI->pixels[iStack_4 * in_RDI->width + local_8 + 1].pixelType == Empty)) {
                  SwapWaterPixel(in_stack_00000020,(IntVec2 *)in_stack_00000018,(IntVec2 *)coords);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void WaterStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y - 1) && gamefield->pixels[(coords.y - 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y -= 1;
            new.x -= 1;
        } else {
            new.y -= 1;
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.x -= 1;
        } else {
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    }
}